

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilist.h
# Opt level: O0

void __thiscall
spvtools::utils::IntrusiveList<spvtools::opt::Instruction>::~IntrusiveList
          (IntrusiveList<spvtools::opt::Instruction> *this)

{
  IntrusiveList<spvtools::opt::Instruction> *this_local;
  
  ~IntrusiveList(this);
  ::operator_delete(this,0x78);
  return;
}

Assistant:

IntrusiveList<NodeType>::~IntrusiveList() {
  clear();
}